

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_16x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  code *pcVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  int8_t *piVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  longlong *plVar12;
  long lVar13;
  int iVar14;
  __m256i *palVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256i buf0 [16];
  __m256i buf1 [16];
  longlong alStack_480 [2];
  int local_46c;
  code *local_468;
  longlong local_460 [134];
  
  piVar10 = av1_fwd_txfm_shift_ls[2];
  uVar3 = (uint)CONCAT71(in_register_00000009,tx_type);
  iVar14 = 0;
  if (uVar3 < 0x10) {
    if ((0x4110U >> (uVar3 & 0x1f) & 1) != 0) {
LAB_00464514:
      lVar13 = 0x200;
      do {
        uVar4 = *(undefined8 *)(input + 4);
        uVar5 = *(undefined8 *)(input + 8);
        uVar6 = *(undefined8 *)(input + 0xc);
        *(undefined8 *)((long)alStack_480 + lVar13) = *(undefined8 *)input;
        *(undefined8 *)((long)alStack_480 + lVar13 + 8) = uVar4;
        *(undefined8 *)(&stack0xfffffffffffffb90 + lVar13) = uVar5;
        *(undefined8 *)((long)&local_468 + lVar13) = uVar6;
        input = input + stride;
        lVar13 = lVar13 + -0x20;
      } while (lVar13 != 0);
      goto LAB_00464531;
    }
    if ((0x80a0U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 6) {
        iVar14 = 1;
        goto LAB_00464514;
      }
    }
    else {
      iVar14 = 1;
    }
  }
  lVar13 = 0;
  do {
    uVar4 = *(undefined8 *)(input + 4);
    uVar5 = *(undefined8 *)(input + 8);
    uVar6 = *(undefined8 *)(input + 0xc);
    *(undefined8 *)((long)local_460 + lVar13) = *(undefined8 *)input;
    *(undefined8 *)((long)local_460 + lVar13 + 8) = uVar4;
    *(undefined8 *)((long)local_460 + lVar13 + 0x10) = uVar5;
    *(undefined8 *)((long)local_460 + lVar13 + 0x18) = uVar6;
    lVar13 = lVar13 + 0x20;
    input = input + stride;
  } while (lVar13 != 0x200);
LAB_00464531:
  pcVar2 = *(code **)((long)col_txfm16x16_arr + (ulong)(uVar3 * 8));
  bVar1 = *av1_fwd_txfm_shift_ls[2];
  uVar11 = (uint)(char)bVar1;
  if ((int)uVar11 < 0) {
    auVar16._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar16._2_2_ = auVar16._0_2_;
    auVar16._4_2_ = auVar16._0_2_;
    auVar16._6_2_ = auVar16._0_2_;
    auVar16._8_2_ = auVar16._0_2_;
    auVar16._10_2_ = auVar16._0_2_;
    auVar16._12_2_ = auVar16._0_2_;
    auVar16._14_2_ = auVar16._0_2_;
    auVar16._16_2_ = auVar16._0_2_;
    auVar16._18_2_ = auVar16._0_2_;
    auVar16._20_2_ = auVar16._0_2_;
    auVar16._22_2_ = auVar16._0_2_;
    auVar16._24_2_ = auVar16._0_2_;
    auVar16._26_2_ = auVar16._0_2_;
    auVar16._28_2_ = auVar16._0_2_;
    auVar16._30_2_ = auVar16._0_2_;
    lVar13 = 0;
    do {
      auVar17 = vpaddsw_avx2(auVar16,*(undefined1 (*) [32])((long)local_460 + lVar13));
      auVar17 = vpsraw_avx2(auVar17,ZEXT416(-uVar11));
      *(undefined1 (*) [32])((long)local_460 + lVar13) = auVar17;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
  }
  else if (bVar1 != 0) {
    lVar13 = 0;
    do {
      auVar16 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_460 + lVar13),ZEXT416(uVar11));
      *(undefined1 (*) [32])((long)local_460 + lVar13) = auVar16;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
  }
  local_468 = *(code **)((long)row_txfm16x16_arr + (ulong)(uVar3 * 8));
  local_46c = iVar14;
  (*pcVar2)(local_460,local_460,0xd);
  bVar1 = piVar10[1];
  if ((char)bVar1 < '\0') {
    auVar17._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar17._2_2_ = auVar17._0_2_;
    auVar17._4_2_ = auVar17._0_2_;
    auVar17._6_2_ = auVar17._0_2_;
    auVar17._8_2_ = auVar17._0_2_;
    auVar17._10_2_ = auVar17._0_2_;
    auVar17._12_2_ = auVar17._0_2_;
    auVar17._14_2_ = auVar17._0_2_;
    auVar17._16_2_ = auVar17._0_2_;
    auVar17._18_2_ = auVar17._0_2_;
    auVar17._20_2_ = auVar17._0_2_;
    auVar17._22_2_ = auVar17._0_2_;
    auVar17._24_2_ = auVar17._0_2_;
    auVar17._26_2_ = auVar17._0_2_;
    auVar17._28_2_ = auVar17._0_2_;
    auVar17._30_2_ = auVar17._0_2_;
    lVar13 = 0;
    do {
      auVar16 = vpaddsw_avx2(auVar17,*(undefined1 (*) [32])((long)local_460 + lVar13));
      auVar16 = vpsraw_avx2(auVar16,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_460 + lVar13) = auVar16;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
  }
  else if (bVar1 != 0) {
    lVar13 = 0;
    do {
      auVar16 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_460 + lVar13),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_460 + lVar13) = auVar16;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
  }
  transpose_16bit_16x16_avx2((__m256i *)local_460,(__m256i *)(local_460 + 0x40));
  palVar15 = (__m256i *)(local_460 + 0x40);
  if (local_46c != 0) {
    lVar13 = 0x200;
    plVar12 = local_460 + 0x40;
    do {
      lVar7 = plVar12[1];
      lVar8 = plVar12[2];
      lVar9 = plVar12[3];
      *(longlong *)((long)alStack_480 + lVar13) = *plVar12;
      *(longlong *)((long)alStack_480 + lVar13 + 8) = lVar7;
      *(longlong *)(&stack0xfffffffffffffb90 + lVar13) = lVar8;
      *(longlong *)((long)&local_468 + lVar13) = lVar9;
      plVar12 = plVar12 + 4;
      lVar13 = lVar13 + -0x20;
      palVar15 = (__m256i *)local_460;
    } while (lVar13 != 0);
  }
  (*local_468)(palVar15,palVar15,0xc);
  bVar1 = piVar10[2];
  if ((char)bVar1 < '\0') {
    auVar18._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar18._2_2_ = auVar18._0_2_;
    auVar18._4_2_ = auVar18._0_2_;
    auVar18._6_2_ = auVar18._0_2_;
    auVar18._8_2_ = auVar18._0_2_;
    auVar18._10_2_ = auVar18._0_2_;
    auVar18._12_2_ = auVar18._0_2_;
    auVar18._14_2_ = auVar18._0_2_;
    auVar18._16_2_ = auVar18._0_2_;
    auVar18._18_2_ = auVar18._0_2_;
    auVar18._20_2_ = auVar18._0_2_;
    auVar18._22_2_ = auVar18._0_2_;
    auVar18._24_2_ = auVar18._0_2_;
    auVar18._26_2_ = auVar18._0_2_;
    auVar18._28_2_ = auVar18._0_2_;
    auVar18._30_2_ = auVar18._0_2_;
    lVar13 = 0;
    do {
      auVar16 = vpaddsw_avx2(auVar18,*(undefined1 (*) [32])((long)*palVar15 + lVar13));
      auVar16 = vpsraw_avx2(auVar16,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)*palVar15 + lVar13) = auVar16;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
  }
  else if (bVar1 != 0) {
    lVar13 = 0;
    do {
      auVar16 = vpsllw_avx2(*(undefined1 (*) [32])((long)*palVar15 + lVar13),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)*palVar15 + lVar13) = auVar16;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x200);
  }
  lVar13 = 0;
  do {
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)*palVar15 + lVar13));
    auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)*palVar15 + lVar13 + 0x10));
    *(undefined1 (*) [32])((long)output + lVar13 * 2) = auVar16;
    *(undefined1 (*) [32])((long)output + lVar13 * 2 + 0x20) = auVar17;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x200);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_16X16;
  __m256i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x16_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int32_t i = 0;
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
  }
  round_shift_16bit_w16_avx2(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit_w16_avx2(buf0, height, shift[1]);
  transpose_16bit_16x16_avx2(buf0, buf1 + 0 * width + 16 * i);

  __m256i *buf;
  if (lr_flip) {
    buf = buf0;
    flip_buf_avx2(buf1 + width * i, buf, width);
  } else {
    buf = buf1 + width * i;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit_w16_avx2(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height, width);
}